

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_0> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,float alpha)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  float *pfVar9;
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  undefined4 extraout_XMM0_Dc_50;
  undefined4 extraout_XMM0_Dc_51;
  undefined4 extraout_XMM0_Dc_52;
  undefined4 extraout_XMM0_Dc_53;
  undefined4 extraout_XMM0_Dc_54;
  undefined4 extraout_XMM0_Dc_55;
  undefined4 extraout_XMM0_Dc_56;
  undefined4 extraout_XMM0_Dc_57;
  undefined4 extraout_XMM0_Dc_58;
  undefined4 extraout_XMM0_Dc_59;
  undefined4 extraout_XMM0_Dc_60;
  undefined4 extraout_XMM0_Dc_61;
  undefined4 extraout_XMM0_Dc_62;
  undefined4 extraout_XMM0_Dc_63;
  undefined4 extraout_XMM0_Dc_64;
  undefined4 extraout_XMM0_Dc_65;
  undefined4 extraout_XMM0_Dc_66;
  undefined4 extraout_XMM0_Dc_67;
  undefined4 extraout_XMM0_Dc_68;
  undefined4 extraout_XMM0_Dc_69;
  undefined4 extraout_XMM0_Dc_70;
  undefined4 extraout_XMM0_Dc_71;
  undefined4 extraout_XMM0_Dc_72;
  undefined4 extraout_XMM0_Dc_73;
  undefined4 extraout_XMM0_Dc_74;
  undefined4 extraout_XMM0_Dc_75;
  undefined4 extraout_XMM0_Dc_76;
  undefined4 extraout_XMM0_Dc_77;
  undefined4 extraout_XMM0_Dc_78;
  undefined4 extraout_XMM0_Dc_79;
  undefined4 extraout_XMM0_Dc_80;
  undefined4 extraout_XMM0_Dc_81;
  undefined4 extraout_XMM0_Dc_82;
  undefined4 extraout_XMM0_Dc_83;
  undefined4 extraout_XMM0_Dc_84;
  undefined4 extraout_XMM0_Dc_85;
  undefined4 extraout_XMM0_Dc_86;
  undefined4 extraout_XMM0_Dc_87;
  undefined4 extraout_XMM0_Dc_88;
  undefined4 extraout_XMM0_Dc_89;
  undefined4 extraout_XMM0_Dc_90;
  undefined4 extraout_XMM0_Dc_91;
  undefined4 extraout_XMM0_Dc_92;
  undefined4 extraout_XMM0_Dc_93;
  undefined4 extraout_XMM0_Dc_94;
  undefined4 extraout_XMM0_Dc_95;
  undefined4 extraout_XMM0_Dc_96;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  float extraout_XMM0_Dd_10;
  float extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  float extraout_XMM0_Dd_13;
  float extraout_XMM0_Dd_14;
  float extraout_XMM0_Dd_15;
  float extraout_XMM0_Dd_16;
  float extraout_XMM0_Dd_17;
  float extraout_XMM0_Dd_18;
  float extraout_XMM0_Dd_19;
  float extraout_XMM0_Dd_20;
  float extraout_XMM0_Dd_21;
  float extraout_XMM0_Dd_22;
  float extraout_XMM0_Dd_23;
  float extraout_XMM0_Dd_24;
  float extraout_XMM0_Dd_25;
  float extraout_XMM0_Dd_26;
  float extraout_XMM0_Dd_27;
  float extraout_XMM0_Dd_28;
  float extraout_XMM0_Dd_29;
  float extraout_XMM0_Dd_30;
  float extraout_XMM0_Dd_31;
  float extraout_XMM0_Dd_32;
  float extraout_XMM0_Dd_33;
  float extraout_XMM0_Dd_34;
  float extraout_XMM0_Dd_35;
  float extraout_XMM0_Dd_36;
  float extraout_XMM0_Dd_37;
  float extraout_XMM0_Dd_38;
  float extraout_XMM0_Dd_39;
  float extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  float extraout_XMM0_Dd_42;
  float extraout_XMM0_Dd_43;
  float extraout_XMM0_Dd_44;
  float extraout_XMM0_Dd_45;
  float extraout_XMM0_Dd_46;
  float extraout_XMM0_Dd_47;
  float extraout_XMM0_Dd_48;
  float extraout_XMM0_Dd_49;
  float extraout_XMM0_Dd_50;
  float extraout_XMM0_Dd_51;
  float extraout_XMM0_Dd_52;
  float extraout_XMM0_Dd_53;
  float extraout_XMM0_Dd_54;
  float extraout_XMM0_Dd_55;
  float extraout_XMM0_Dd_56;
  float extraout_XMM0_Dd_57;
  float extraout_XMM0_Dd_58;
  float extraout_XMM0_Dd_59;
  float extraout_XMM0_Dd_60;
  float extraout_XMM0_Dd_61;
  undefined4 extraout_XMM0_Dd_62;
  float extraout_XMM0_Dd_63;
  float extraout_XMM0_Dd_64;
  float extraout_XMM0_Dd_65;
  float extraout_XMM0_Dd_66;
  float extraout_XMM0_Dd_67;
  float extraout_XMM0_Dd_68;
  float extraout_XMM0_Dd_69;
  float extraout_XMM0_Dd_70;
  float extraout_XMM0_Dd_71;
  float extraout_XMM0_Dd_72;
  float extraout_XMM0_Dd_73;
  float extraout_XMM0_Dd_74;
  float extraout_XMM0_Dd_75;
  float extraout_XMM0_Dd_76;
  float extraout_XMM0_Dd_77;
  undefined4 extraout_XMM0_Dd_78;
  float extraout_XMM0_Dd_79;
  float extraout_XMM0_Dd_80;
  float extraout_XMM0_Dd_81;
  float extraout_XMM0_Dd_82;
  float extraout_XMM0_Dd_83;
  float extraout_XMM0_Dd_84;
  float extraout_XMM0_Dd_85;
  float extraout_XMM0_Dd_86;
  float extraout_XMM0_Dd_87;
  float extraout_XMM0_Dd_88;
  undefined4 extraout_XMM0_Dd_89;
  float extraout_XMM0_Dd_90;
  float extraout_XMM0_Dd_91;
  float extraout_XMM0_Dd_92;
  float extraout_XMM0_Dd_93;
  float extraout_XMM0_Dd_94;
  float extraout_XMM0_Dd_95;
  float extraout_XMM0_Dd_96;
  Packet4f afVar11;
  float afVar12 [4];
  const_blas_data_mapper<float,_long,_0> *local_ba0;
  long local_b98;
  long j_5;
  ResScalar c0_5;
  float afStack_b88 [4];
  Packet4f local_b78;
  float local_b68 [4];
  undefined1 auStack_b58 [8];
  RhsPacket b0_4;
  long j_4;
  undefined1 auStack_b38 [8];
  ResPacket c0_4;
  Packet4f local_b18;
  float local_b08 [4];
  Packet4f local_af8;
  float local_ae8 [4];
  float local_ad8 [4];
  undefined1 auStack_ac8 [8];
  RhsPacket b0_3;
  long j_3;
  undefined1 auStack_aa8 [8];
  ResPacket c1_3;
  float local_a8c;
  undefined1 auStack_a88 [8];
  ResPacket c0_3;
  Packet4f local_a68;
  float local_a58 [4];
  Packet4f local_a48;
  float local_a38 [4];
  Packet4f local_a28;
  float local_a18 [4];
  float local_a08 [4];
  float local_9f8 [4];
  undefined1 auStack_9e8 [8];
  RhsPacket b0_2;
  long j_2;
  undefined1 auStack_9c8 [8];
  ResPacket c2_2;
  float local_9ac;
  undefined1 auStack_9a8 [8];
  ResPacket c1_2;
  float local_98c;
  undefined1 auStack_988 [8];
  ResPacket c0_2;
  Packet4f local_968;
  float local_958 [4];
  Packet4f local_948;
  float local_938 [4];
  Packet4f local_928;
  float local_918 [4];
  Packet4f local_908;
  float local_8f8 [4];
  float local_8e8 [4];
  float local_8d8 [4];
  float local_8c8 [4];
  undefined1 auStack_8b8 [8];
  RhsPacket b0_1;
  long j_1;
  undefined1 auStack_898 [8];
  ResPacket c3_1;
  float local_87c;
  undefined1 auStack_878 [8];
  ResPacket c2_1;
  float local_85c;
  undefined1 auStack_858 [8];
  ResPacket c1_1;
  float local_83c;
  undefined1 auStack_838 [8];
  ResPacket c0_1;
  Packet4f local_818;
  float local_808 [4];
  Packet4f local_7f8;
  float local_7e8 [4];
  Packet4f local_7d8;
  float local_7c8 [4];
  Packet4f local_7b8;
  float local_7a8 [4];
  Packet4f local_798;
  float local_788 [4];
  Packet4f local_778;
  float local_768 [4];
  Packet4f local_758;
  float local_748 [4];
  Packet4f local_738;
  float local_728 [4];
  float local_718 [4];
  float local_708 [4];
  float local_6f8 [4];
  float local_6e8 [4];
  float local_6d8 [4];
  float local_6c8 [4];
  float local_6b8 [4];
  undefined1 auStack_6a8 [8];
  RhsPacket b0;
  long j;
  undefined1 auStack_688 [8];
  ResPacket c7;
  float local_66c;
  undefined1 auStack_668 [8];
  ResPacket c6;
  float local_64c;
  undefined1 auStack_648 [8];
  ResPacket c5;
  float local_62c;
  undefined1 auStack_628 [8];
  ResPacket c4;
  float local_60c;
  undefined1 auStack_608 [8];
  ResPacket c3;
  float local_5ec;
  undefined1 auStack_5e8 [8];
  ResPacket c2;
  float local_5cc;
  undefined1 auStack_5c8 [8];
  ResPacket c1;
  float local_5ac;
  undefined1 auStack_5a8 [8];
  ResPacket c0;
  long i;
  long local_588;
  long jend;
  long j2;
  ResPacketQuarter palpha_quarter;
  ResPacketHalf palpha_half;
  ResPacket palpha;
  long block_cols;
  long n_quarter;
  long n_half;
  long n1;
  long n2;
  long n3;
  long n4;
  long n8;
  long lhsStride;
  undefined1 auStack_4f8 [4];
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj_quarter;
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj_half;
  conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
  pcj;
  conj_helper<float,_float,_false,_false> cj;
  const_blas_data_mapper<float,_long,_0> lhs;
  long lStack_4e0;
  float alpha_local;
  long resIncr_local;
  ResScalar *res_local;
  const_blas_data_mapper<float,_long,_0> *rhs_local;
  const_blas_data_mapper<float,_long,_0> *alhs_local;
  long cols_local;
  long rows_local;
  long *local_4a8;
  float local_4a0 [2];
  float local_498 [2];
  undefined1 *local_490;
  float *local_488;
  float local_480 [2];
  long local_478;
  undefined1 *local_470;
  float *local_468;
  float local_460 [2];
  float local_458 [2];
  undefined1 *local_450;
  float *local_448;
  float local_440 [2];
  long local_438;
  undefined1 *local_430;
  float *local_428;
  float local_420 [2];
  long local_418;
  undefined1 *local_410;
  float *local_408;
  float local_400 [2];
  float local_3f8 [2];
  undefined1 *local_3f0;
  float *local_3e8;
  float local_3e0 [2];
  long local_3d8;
  undefined1 *local_3d0;
  float *local_3c8;
  float local_3c0 [2];
  long local_3b8;
  undefined1 *local_3b0;
  float *local_3a8;
  float local_3a0 [2];
  long local_398;
  undefined1 *local_390;
  float *local_388;
  float local_380 [2];
  float local_378 [2];
  undefined1 *local_370;
  float *local_368;
  float local_360 [2];
  long local_358;
  undefined1 *local_350;
  float *local_348;
  float local_340 [2];
  long local_338;
  undefined1 *local_330;
  float *local_328;
  float local_320 [2];
  long local_318;
  undefined1 *local_310;
  float *local_308;
  float local_300 [2];
  long local_2f8;
  undefined1 *local_2f0;
  float *local_2e8;
  float local_2e0 [2];
  long local_2d8;
  undefined1 *local_2d0;
  float *local_2c8;
  float local_2c0 [2];
  long local_2b8;
  undefined1 *local_2b0;
  float *local_2a8;
  float local_2a0 [2];
  long local_298;
  undefined1 *local_290;
  float *local_288;
  float local_280 [2];
  float local_278 [2];
  undefined1 *local_270;
  float *local_268;
  float local_260 [2];
  float local_258 [2];
  undefined1 *local_250;
  float local_248 [2];
  long local_240;
  undefined1 *local_238;
  float local_230 [2];
  long local_228;
  undefined1 *local_220;
  float local_218 [2];
  long local_210;
  undefined1 *local_208;
  float local_200 [2];
  long local_1f8;
  undefined1 *local_1f0;
  float local_1e8 [2];
  long local_1e0;
  undefined1 *local_1d8;
  float local_1d0 [2];
  long local_1c8;
  undefined1 *local_1c0;
  float local_1b8 [2];
  long local_1b0;
  undefined1 *local_1a8;
  float local_1a0 [2];
  float local_198 [2];
  undefined1 *local_190;
  float local_188 [2];
  long local_180;
  undefined1 *local_178;
  float local_170 [2];
  long local_168;
  undefined1 *local_160;
  float local_158 [2];
  long local_150;
  undefined1 *local_148;
  float local_140 [2];
  float local_138 [2];
  undefined1 *local_130;
  float local_128 [2];
  long local_120;
  undefined1 *local_118;
  float local_110 [2];
  long local_108;
  undefined1 *local_100;
  float local_f8 [2];
  float local_f0 [2];
  undefined1 *local_e8;
  float local_e0 [2];
  long local_d8;
  undefined1 *local_d0;
  float local_c8 [2];
  float local_c0 [2];
  undefined1 *local_b8;
  undefined8 local_b0;
  long local_a8;
  ResScalar *local_a0;
  long local_98;
  float local_90 [2];
  undefined1 *local_88;
  undefined8 local_80;
  float local_78 [2];
  ResScalar *local_70;
  undefined8 local_68;
  float local_60 [2];
  ResScalar *local_58;
  undefined8 local_50;
  float local_48 [2];
  ResScalar *local_40;
  undefined8 local_38;
  float local_30 [2];
  ResScalar *local_28;
  undefined8 local_20;
  float local_18 [2];
  ResScalar *local_10;
  
  lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride._4_4_ = alpha;
  lStack_4e0 = resIncr;
  resIncr_local = (long)res;
  res_local = (ResScalar *)rhs;
  rhs_local = alhs;
  alhs_local = (const_blas_data_mapper<float,_long,_0> *)cols;
  cols_local = rows;
  ignore_unused_variable<long>(&stack0xfffffffffffffb20);
  _auStack_4f8 = (rhs_local->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
  lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)(rhs_local->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
  lVar2 = blas_data_mapper<const_float,_long,_0,_0,_1>::stride
                    ((blas_data_mapper<const_float,_long,_0,_0,_1> *)auStack_4f8);
  lVar3 = cols_local + -0x1f;
  lVar4 = cols_local + -0xf;
  lVar5 = cols_local + -0xb;
  lVar6 = cols_local + -7;
  lVar7 = cols_local + -3;
  if ((long)alhs_local < 0x80) {
    local_ba0 = alhs_local;
  }
  else {
    iVar1 = 4;
    if ((ulong)(lVar2 << 2) < 32000) {
      iVar1 = 0x10;
    }
    local_ba0 = (const_blas_data_mapper<float,_long,_0> *)(long)iVar1;
  }
  afVar11 = pset1<float__vector(4)>
                      ((float *)((long)&lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.
                                        m_stride + 4));
  unique0x10000440 = extraout_XMM0_Dc;
  palpha_half._8_8_ = afVar11._0_8_;
  unique0x10000444 = extraout_XMM0_Dd;
  afVar11 = pset1<float__vector(4)>
                      ((float *)((long)&lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.
                                        m_stride + 4));
  unique0x10000464 = extraout_XMM0_Dc_00;
  palpha_quarter._8_8_ = afVar11._0_8_;
  unique0x10000468 = extraout_XMM0_Dd_00;
  afVar11 = pset1<float__vector(4)>
                      ((float *)((long)&lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.
                                        m_stride + 4));
  unique0x10000488 = extraout_XMM0_Dc_01;
  j2 = afVar11._0_8_;
  unique0x1000048c = extraout_XMM0_Dd_01;
  for (jend = 0; jend < (long)alhs_local;
      jend = (long)&(local_ba0->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data + jend) {
    i = (long)&(local_ba0->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data + jend;
    local_4a8 = &i;
    rows_local = (long)&alhs_local;
    plVar8 = std::min<long>(local_4a8,(long *)rows_local);
    local_588 = *plVar8;
    c0[2] = 0.0;
    c0[3] = 0.0;
    for (; (long)c0._8_8_ < lVar3; c0._8_8_ = c0._8_8_ + 0x20) {
      local_5ac = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_5ac);
      unique0x100004ac = (float)extraout_XMM0_Dc_02;
      auStack_5a8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_5a8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x100004b0 = extraout_XMM0_Dd_02;
      local_5cc = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_5cc);
      unique0x100004d0 = (float)extraout_XMM0_Dc_03;
      auStack_5c8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_5c8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x100004d4 = extraout_XMM0_Dd_03;
      local_5ec = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_5ec);
      unique0x100004f4 = (float)extraout_XMM0_Dc_04;
      auStack_5e8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_5e8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x100004f8 = extraout_XMM0_Dd_04;
      local_60c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_60c);
      unique0x10000518 = (float)extraout_XMM0_Dc_05;
      auStack_608._0_4_ = (float)(int)afVar11._0_8_;
      auStack_608._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x1000051c = extraout_XMM0_Dd_05;
      local_62c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_62c);
      unique0x1000053c = (float)extraout_XMM0_Dc_06;
      auStack_628._0_4_ = (float)(int)afVar11._0_8_;
      auStack_628._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000540 = extraout_XMM0_Dd_06;
      local_64c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_64c);
      unique0x10000560 = (float)extraout_XMM0_Dc_07;
      auStack_648._0_4_ = (float)(int)afVar11._0_8_;
      auStack_648._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000564 = extraout_XMM0_Dd_07;
      local_66c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_66c);
      unique0x10000584 = (float)extraout_XMM0_Dc_08;
      auStack_668._0_4_ = (float)(int)afVar11._0_8_;
      auStack_668._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000588 = extraout_XMM0_Dd_08;
      j._4_4_ = 0;
      afVar11 = pset1<float__vector(4)>((float *)((long)&j + 4));
      unique0x100005a8 = (float)extraout_XMM0_Dc_09;
      auStack_688._0_4_ = (float)(int)afVar11._0_8_;
      auStack_688._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x100005ac = extraout_XMM0_Dd_09;
      b0[2] = (float)(undefined4)jend;
      b0[3] = (float)jend._4_4_;
      for (; (long)b0._8_8_ < local_588; b0._8_8_ = b0._8_8_ + 1) {
        local_10 = res_local;
        local_18[0] = b0[2];
        local_18[1] = b0[3];
        local_20 = 0;
        afVar11 = pset1<float__vector(4)>((float *)(*(long *)res_local + b0._8_8_ * 4));
        unique0x100005cc = (float)extraout_XMM0_Dc_10;
        auStack_6a8._0_4_ = (float)(int)afVar11._0_8_;
        auStack_6a8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        unique0x100005d0 = extraout_XMM0_Dd_10;
        local_270 = auStack_4f8;
        local_278[0] = c0[2];
        local_278[1] = c0[3];
        local_280[0] = b0[2];
        local_280[1] = b0[3];
        local_258[0] = c0[2];
        local_258[1] = c0[3];
        local_260[0] = b0[2];
        local_260[1] = b0[3];
        local_268 = _auStack_4f8 +
                    c0._8_8_ +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_250 = local_270;
        afVar11 = ploadu<float__vector(4)>(local_268);
        local_6b8[2] = (float)extraout_XMM0_Dc_11;
        local_6b8[0] = (float)(int)afVar11._0_8_;
        local_6b8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_6b8[3] = extraout_XMM0_Dd_11;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_6b8,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_5a8);
        unique0x10000614 = (float)extraout_XMM0_Dc_12;
        auStack_5a8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_5a8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000618 = extraout_XMM0_Dd_12;
        local_298 = c0._8_8_ + 4;
        local_290 = auStack_4f8;
        local_2a0[0] = b0[2];
        local_2a0[1] = b0[3];
        local_248[0] = b0[2];
        local_248[1] = b0[3];
        local_288 = _auStack_4f8 +
                    local_298 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_240 = local_298;
        local_238 = local_290;
        afVar11 = ploadu<float__vector(4)>(local_288);
        local_6c8[2] = (float)extraout_XMM0_Dc_13;
        local_6c8[0] = (float)(int)afVar11._0_8_;
        local_6c8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_6c8[3] = extraout_XMM0_Dd_13;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_6c8,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_5c8);
        unique0x1000065c = (float)extraout_XMM0_Dc_14;
        auStack_5c8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_5c8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000660 = extraout_XMM0_Dd_14;
        local_2b8 = c0._8_8_ + 8;
        local_2b0 = auStack_4f8;
        local_2c0[0] = b0[2];
        local_2c0[1] = b0[3];
        local_230[0] = b0[2];
        local_230[1] = b0[3];
        local_2a8 = _auStack_4f8 +
                    local_2b8 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_228 = local_2b8;
        local_220 = local_2b0;
        afVar11 = ploadu<float__vector(4)>(local_2a8);
        local_6d8[2] = (float)extraout_XMM0_Dc_15;
        local_6d8[0] = (float)(int)afVar11._0_8_;
        local_6d8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_6d8[3] = extraout_XMM0_Dd_15;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_6d8,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_5e8);
        unique0x100006a4 = (float)extraout_XMM0_Dc_16;
        auStack_5e8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_5e8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x100006a8 = extraout_XMM0_Dd_16;
        local_2d8 = c0._8_8_ + 0xc;
        local_2d0 = auStack_4f8;
        local_2e0[0] = b0[2];
        local_2e0[1] = b0[3];
        local_218[0] = b0[2];
        local_218[1] = b0[3];
        local_2c8 = _auStack_4f8 +
                    local_2d8 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_210 = local_2d8;
        local_208 = local_2d0;
        afVar11 = ploadu<float__vector(4)>(local_2c8);
        local_6e8[2] = (float)extraout_XMM0_Dc_17;
        local_6e8[0] = (float)(int)afVar11._0_8_;
        local_6e8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_6e8[3] = extraout_XMM0_Dd_17;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_6e8,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_608);
        unique0x100006ec = (float)extraout_XMM0_Dc_18;
        auStack_608._0_4_ = (float)(int)afVar12._0_8_;
        auStack_608._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x100006f0 = extraout_XMM0_Dd_18;
        local_2f8 = c0._8_8_ + 0x10;
        local_2f0 = auStack_4f8;
        local_300[0] = b0[2];
        local_300[1] = b0[3];
        local_200[0] = b0[2];
        local_200[1] = b0[3];
        local_2e8 = _auStack_4f8 +
                    local_2f8 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_1f8 = local_2f8;
        local_1f0 = local_2f0;
        afVar11 = ploadu<float__vector(4)>(local_2e8);
        local_6f8[2] = (float)extraout_XMM0_Dc_19;
        local_6f8[0] = (float)(int)afVar11._0_8_;
        local_6f8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_6f8[3] = extraout_XMM0_Dd_19;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_6f8,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_628);
        unique0x10000734 = (float)extraout_XMM0_Dc_20;
        auStack_628._0_4_ = (float)(int)afVar12._0_8_;
        auStack_628._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000738 = extraout_XMM0_Dd_20;
        local_318 = c0._8_8_ + 0x14;
        local_310 = auStack_4f8;
        local_320[0] = b0[2];
        local_320[1] = b0[3];
        local_1e8[0] = b0[2];
        local_1e8[1] = b0[3];
        local_308 = _auStack_4f8 +
                    local_318 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_1e0 = local_318;
        local_1d8 = local_310;
        afVar11 = ploadu<float__vector(4)>(local_308);
        local_708[2] = (float)extraout_XMM0_Dc_21;
        local_708[0] = (float)(int)afVar11._0_8_;
        local_708[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_708[3] = extraout_XMM0_Dd_21;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_708,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_648);
        unique0x1000077c = (float)extraout_XMM0_Dc_22;
        auStack_648._0_4_ = (float)(int)afVar12._0_8_;
        auStack_648._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000780 = extraout_XMM0_Dd_22;
        local_338 = c0._8_8_ + 0x18;
        local_330 = auStack_4f8;
        local_340[0] = b0[2];
        local_340[1] = b0[3];
        local_1d0[0] = b0[2];
        local_1d0[1] = b0[3];
        local_328 = _auStack_4f8 +
                    local_338 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_1c8 = local_338;
        local_1c0 = local_330;
        afVar11 = ploadu<float__vector(4)>(local_328);
        local_718[2] = (float)extraout_XMM0_Dc_23;
        local_718[0] = (float)(int)afVar11._0_8_;
        local_718[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_718[3] = extraout_XMM0_Dd_23;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_718,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_668);
        unique0x100007c4 = (float)extraout_XMM0_Dc_24;
        auStack_668._0_4_ = (float)(int)afVar12._0_8_;
        auStack_668._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x100007c8 = extraout_XMM0_Dd_24;
        local_358 = c0._8_8_ + 0x1c;
        local_350 = auStack_4f8;
        local_360[0] = b0[2];
        local_360[1] = b0[3];
        local_1b8[0] = b0[2];
        local_1b8[1] = b0[3];
        local_348 = _auStack_4f8 +
                    local_358 +
                    b0._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        local_1b0 = local_358;
        local_1a8 = local_350;
        afVar11 = ploadu<float__vector(4)>(local_348);
        local_728[2] = (float)extraout_XMM0_Dc_25;
        local_728[0] = (float)(int)afVar11._0_8_;
        local_728[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_728[3] = extraout_XMM0_Dd_25;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_728,(float (*) [4])auStack_6a8,
                          (float (*) [4])auStack_688);
        unique0x1000080c = (float)extraout_XMM0_Dc_26;
        auStack_688._0_4_ = (float)(int)afVar12._0_8_;
        auStack_688._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000810 = extraout_XMM0_Dd_26;
      }
      pfVar9 = (float *)(resIncr_local + c0._8_8_ * 4);
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4));
      local_748[2] = (float)extraout_XMM0_Dc_27;
      local_748[0] = (float)(int)afVar11._0_8_;
      local_748[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_748[3] = extraout_XMM0_Dd_27;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_5a8,(float (*) [4])(palpha_half + 2),&local_748);
      local_738[2] = (float)extraout_XMM0_Dc_28;
      local_738[0] = (float)(int)afVar12._0_8_;
      local_738[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_738[3] = extraout_XMM0_Dd_28;
      pstoreu<float,float__vector(4)>(pfVar9,&local_738);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x10));
      local_768[2] = (float)extraout_XMM0_Dc_29;
      local_768[0] = (float)(int)afVar11._0_8_;
      local_768[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_768[3] = extraout_XMM0_Dd_29;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_5c8,(float (*) [4])(palpha_half + 2),&local_768);
      local_758[2] = (float)extraout_XMM0_Dc_30;
      local_758[0] = (float)(int)afVar12._0_8_;
      local_758[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_758[3] = extraout_XMM0_Dd_30;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x10),&local_758);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x20));
      local_788[2] = (float)extraout_XMM0_Dc_31;
      local_788[0] = (float)(int)afVar11._0_8_;
      local_788[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_788[3] = extraout_XMM0_Dd_31;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_5e8,(float (*) [4])(palpha_half + 2),&local_788);
      local_778[2] = (float)extraout_XMM0_Dc_32;
      local_778[0] = (float)(int)afVar12._0_8_;
      local_778[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_778[3] = extraout_XMM0_Dd_32;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x20),&local_778);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x30));
      local_7a8[2] = (float)extraout_XMM0_Dc_33;
      local_7a8[0] = (float)(int)afVar11._0_8_;
      local_7a8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_7a8[3] = extraout_XMM0_Dd_33;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_608,(float (*) [4])(palpha_half + 2),&local_7a8);
      local_798[2] = (float)extraout_XMM0_Dc_34;
      local_798[0] = (float)(int)afVar12._0_8_;
      local_798[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_798[3] = extraout_XMM0_Dd_34;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x30),&local_798);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x40));
      local_7c8[2] = (float)extraout_XMM0_Dc_35;
      local_7c8[0] = (float)(int)afVar11._0_8_;
      local_7c8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_7c8[3] = extraout_XMM0_Dd_35;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_628,(float (*) [4])(palpha_half + 2),&local_7c8);
      local_7b8[2] = (float)extraout_XMM0_Dc_36;
      local_7b8[0] = (float)(int)afVar12._0_8_;
      local_7b8[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_7b8[3] = extraout_XMM0_Dd_36;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x40),&local_7b8);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x50));
      local_7e8[2] = (float)extraout_XMM0_Dc_37;
      local_7e8[0] = (float)(int)afVar11._0_8_;
      local_7e8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_7e8[3] = extraout_XMM0_Dd_37;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_648,(float (*) [4])(palpha_half + 2),&local_7e8);
      local_7d8[2] = (float)extraout_XMM0_Dc_38;
      local_7d8[0] = (float)(int)afVar12._0_8_;
      local_7d8[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_7d8[3] = extraout_XMM0_Dd_38;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x50),&local_7d8);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x60));
      local_808[2] = (float)extraout_XMM0_Dc_39;
      local_808[0] = (float)(int)afVar11._0_8_;
      local_808[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_808[3] = extraout_XMM0_Dd_39;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_668,(float (*) [4])(palpha_half + 2),&local_808);
      local_7f8[2] = (float)extraout_XMM0_Dc_40;
      local_7f8[0] = (float)(int)afVar12._0_8_;
      local_7f8[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_7f8[3] = extraout_XMM0_Dd_40;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x60),&local_7f8);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x70));
      unique0x10000a28 = extraout_XMM0_Dc_41;
      c0_1._8_8_ = afVar11._0_8_;
      unique0x10000a2c = extraout_XMM0_Dd_41;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_688,(float (*) [4])(palpha_half + 2),
                           (float (*) [4])(c0_1 + 2));
      local_818[2] = (float)extraout_XMM0_Dc_42;
      local_818[0] = (float)(int)afVar12._0_8_;
      local_818[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_818[3] = extraout_XMM0_Dd_42;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x70),&local_818);
    }
    if ((long)c0._8_8_ < lVar4) {
      local_83c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_83c);
      unique0x10000a70 = (float)extraout_XMM0_Dc_43;
      auStack_838._0_4_ = (float)(int)afVar11._0_8_;
      auStack_838._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000a74 = extraout_XMM0_Dd_43;
      local_85c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_85c);
      unique0x10000a94 = (float)extraout_XMM0_Dc_44;
      auStack_858._0_4_ = (float)(int)afVar11._0_8_;
      auStack_858._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000a98 = extraout_XMM0_Dd_44;
      local_87c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_87c);
      unique0x10000ab8 = (float)extraout_XMM0_Dc_45;
      auStack_878._0_4_ = (float)(int)afVar11._0_8_;
      auStack_878._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000abc = extraout_XMM0_Dd_45;
      j_1._4_4_ = 0;
      afVar11 = pset1<float__vector(4)>((float *)((long)&j_1 + 4));
      unique0x10000adc = (float)extraout_XMM0_Dc_46;
      auStack_898._0_4_ = (float)(int)afVar11._0_8_;
      auStack_898._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000ae0 = extraout_XMM0_Dd_46;
      b0_1[2] = (float)(undefined4)jend;
      b0_1[3] = (float)jend._4_4_;
      for (; (long)b0_1._8_8_ < local_588; b0_1._8_8_ = b0_1._8_8_ + 1) {
        local_28 = res_local;
        local_30[0] = b0_1[2];
        local_30[1] = b0_1[3];
        local_38 = 0;
        afVar11 = pset1<float__vector(4)>((float *)(*(long *)res_local + b0_1._8_8_ * 4));
        unique0x10000b00 = (float)extraout_XMM0_Dc_47;
        auStack_8b8._0_4_ = (float)(int)afVar11._0_8_;
        auStack_8b8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        unique0x10000b04 = extraout_XMM0_Dd_47;
        local_370 = auStack_4f8;
        local_378[0] = c0[2];
        local_378[1] = c0[3];
        local_380[0] = b0_1[2];
        local_380[1] = b0_1[3];
        local_198[0] = c0[2];
        local_198[1] = c0[3];
        local_1a0[0] = b0_1[2];
        local_1a0[1] = b0_1[3];
        local_368 = _auStack_4f8 +
                    c0._8_8_ +
                    b0_1._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_190 = local_370;
        afVar11 = ploadu<float__vector(4)>(local_368);
        local_8c8[2] = (float)extraout_XMM0_Dc_48;
        local_8c8[0] = (float)(int)afVar11._0_8_;
        local_8c8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_8c8[3] = extraout_XMM0_Dd_48;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_8c8,(float (*) [4])auStack_8b8,
                          (float (*) [4])auStack_838);
        unique0x10000b48 = (float)extraout_XMM0_Dc_49;
        auStack_838._0_4_ = (float)(int)afVar12._0_8_;
        auStack_838._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000b4c = extraout_XMM0_Dd_49;
        local_398 = c0._8_8_ + 4;
        local_390 = auStack_4f8;
        local_3a0[0] = b0_1[2];
        local_3a0[1] = b0_1[3];
        local_188[0] = b0_1[2];
        local_188[1] = b0_1[3];
        local_388 = _auStack_4f8 +
                    local_398 +
                    b0_1._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_180 = local_398;
        local_178 = local_390;
        afVar11 = ploadu<float__vector(4)>(local_388);
        local_8d8[2] = (float)extraout_XMM0_Dc_50;
        local_8d8[0] = (float)(int)afVar11._0_8_;
        local_8d8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_8d8[3] = extraout_XMM0_Dd_50;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_8d8,(float (*) [4])auStack_8b8,
                          (float (*) [4])auStack_858);
        unique0x10000b90 = (float)extraout_XMM0_Dc_51;
        auStack_858._0_4_ = (float)(int)afVar12._0_8_;
        auStack_858._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000b94 = extraout_XMM0_Dd_51;
        local_3b8 = c0._8_8_ + 8;
        local_3b0 = auStack_4f8;
        local_3c0[0] = b0_1[2];
        local_3c0[1] = b0_1[3];
        local_170[0] = b0_1[2];
        local_170[1] = b0_1[3];
        local_3a8 = _auStack_4f8 +
                    local_3b8 +
                    b0_1._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_168 = local_3b8;
        local_160 = local_3b0;
        afVar11 = ploadu<float__vector(4)>(local_3a8);
        local_8e8[2] = (float)extraout_XMM0_Dc_52;
        local_8e8[0] = (float)(int)afVar11._0_8_;
        local_8e8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_8e8[3] = extraout_XMM0_Dd_52;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_8e8,(float (*) [4])auStack_8b8,
                          (float (*) [4])auStack_878);
        unique0x10000bd8 = (float)extraout_XMM0_Dc_53;
        auStack_878._0_4_ = (float)(int)afVar12._0_8_;
        auStack_878._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000bdc = extraout_XMM0_Dd_53;
        local_3d8 = c0._8_8_ + 0xc;
        local_3d0 = auStack_4f8;
        local_3e0[0] = b0_1[2];
        local_3e0[1] = b0_1[3];
        local_158[0] = b0_1[2];
        local_158[1] = b0_1[3];
        local_3c8 = _auStack_4f8 +
                    local_3d8 +
                    b0_1._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_150 = local_3d8;
        local_148 = local_3d0;
        afVar11 = ploadu<float__vector(4)>(local_3c8);
        local_8f8[2] = (float)extraout_XMM0_Dc_54;
        local_8f8[0] = (float)(int)afVar11._0_8_;
        local_8f8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_8f8[3] = extraout_XMM0_Dd_54;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_8f8,(float (*) [4])auStack_8b8,
                          (float (*) [4])auStack_898);
        unique0x10000c20 = (float)extraout_XMM0_Dc_55;
        auStack_898._0_4_ = (float)(int)afVar12._0_8_;
        auStack_898._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000c24 = extraout_XMM0_Dd_55;
      }
      pfVar9 = (float *)(resIncr_local + c0._8_8_ * 4);
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4));
      local_918[2] = (float)extraout_XMM0_Dc_56;
      local_918[0] = (float)(int)afVar11._0_8_;
      local_918[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_918[3] = extraout_XMM0_Dd_56;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_838,(float (*) [4])(palpha_half + 2),&local_918);
      local_908[2] = (float)extraout_XMM0_Dc_57;
      local_908[0] = (float)(int)afVar12._0_8_;
      local_908[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_908[3] = extraout_XMM0_Dd_57;
      pstoreu<float,float__vector(4)>(pfVar9,&local_908);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x10));
      local_938[2] = (float)extraout_XMM0_Dc_58;
      local_938[0] = (float)(int)afVar11._0_8_;
      local_938[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_938[3] = extraout_XMM0_Dd_58;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_858,(float (*) [4])(palpha_half + 2),&local_938);
      local_928[2] = (float)extraout_XMM0_Dc_59;
      local_928[0] = (float)(int)afVar12._0_8_;
      local_928[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_928[3] = extraout_XMM0_Dd_59;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x10),&local_928);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x20));
      local_958[2] = (float)extraout_XMM0_Dc_60;
      local_958[0] = (float)(int)afVar11._0_8_;
      local_958[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_958[3] = extraout_XMM0_Dd_60;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_878,(float (*) [4])(palpha_half + 2),&local_958);
      local_948[2] = (float)extraout_XMM0_Dc_61;
      local_948[0] = (float)(int)afVar12._0_8_;
      local_948[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_948[3] = extraout_XMM0_Dd_61;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x20),&local_948);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x30));
      unique0x10000d1c = extraout_XMM0_Dc_62;
      c0_2._8_8_ = afVar11._0_8_;
      unique0x10000d20 = extraout_XMM0_Dd_62;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_898,(float (*) [4])(palpha_half + 2),
                           (float (*) [4])(c0_2 + 2));
      local_968[2] = (float)extraout_XMM0_Dc_63;
      local_968[0] = (float)(int)afVar12._0_8_;
      local_968[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_968[3] = extraout_XMM0_Dd_63;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x30),&local_968);
      c0._8_8_ = c0._8_8_ + 0x10;
    }
    if ((long)c0._8_8_ < lVar5) {
      local_98c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_98c);
      unique0x10000d64 = (float)extraout_XMM0_Dc_64;
      auStack_988._0_4_ = (float)(int)afVar11._0_8_;
      auStack_988._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000d68 = extraout_XMM0_Dd_64;
      local_9ac = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_9ac);
      unique0x10000d88 = (float)extraout_XMM0_Dc_65;
      auStack_9a8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_9a8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000d8c = extraout_XMM0_Dd_65;
      j_2._4_4_ = 0;
      afVar11 = pset1<float__vector(4)>((float *)((long)&j_2 + 4));
      unique0x10000dac = (float)extraout_XMM0_Dc_66;
      auStack_9c8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_9c8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000db0 = extraout_XMM0_Dd_66;
      b0_2[2] = (float)(undefined4)jend;
      b0_2[3] = (float)jend._4_4_;
      for (; (long)b0_2._8_8_ < local_588; b0_2._8_8_ = b0_2._8_8_ + 1) {
        local_40 = res_local;
        local_48[0] = b0_2[2];
        local_48[1] = b0_2[3];
        local_50 = 0;
        afVar11 = pset1<float__vector(4)>((float *)(*(long *)res_local + b0_2._8_8_ * 4));
        unique0x10000dd0 = (float)extraout_XMM0_Dc_67;
        auStack_9e8._0_4_ = (float)(int)afVar11._0_8_;
        auStack_9e8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        unique0x10000dd4 = extraout_XMM0_Dd_67;
        local_3f0 = auStack_4f8;
        local_3f8[0] = c0[2];
        local_3f8[1] = c0[3];
        local_400[0] = b0_2[2];
        local_400[1] = b0_2[3];
        local_138[0] = c0[2];
        local_138[1] = c0[3];
        local_140[0] = b0_2[2];
        local_140[1] = b0_2[3];
        local_3e8 = _auStack_4f8 +
                    c0._8_8_ +
                    b0_2._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_130 = local_3f0;
        afVar11 = ploadu<float__vector(4)>(local_3e8);
        local_9f8[2] = (float)extraout_XMM0_Dc_68;
        local_9f8[0] = (float)(int)afVar11._0_8_;
        local_9f8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_9f8[3] = extraout_XMM0_Dd_68;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_9f8,(float (*) [4])auStack_9e8,
                          (float (*) [4])auStack_988);
        unique0x10000e18 = (float)extraout_XMM0_Dc_69;
        auStack_988._0_4_ = (float)(int)afVar12._0_8_;
        auStack_988._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000e1c = extraout_XMM0_Dd_69;
        local_418 = c0._8_8_ + 4;
        local_410 = auStack_4f8;
        local_420[0] = b0_2[2];
        local_420[1] = b0_2[3];
        local_128[0] = b0_2[2];
        local_128[1] = b0_2[3];
        local_408 = _auStack_4f8 +
                    local_418 +
                    b0_2._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_120 = local_418;
        local_118 = local_410;
        afVar11 = ploadu<float__vector(4)>(local_408);
        local_a08[2] = (float)extraout_XMM0_Dc_70;
        local_a08[0] = (float)(int)afVar11._0_8_;
        local_a08[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_a08[3] = extraout_XMM0_Dd_70;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_a08,(float (*) [4])auStack_9e8,
                          (float (*) [4])auStack_9a8);
        unique0x10000e60 = (float)extraout_XMM0_Dc_71;
        auStack_9a8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_9a8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000e64 = extraout_XMM0_Dd_71;
        local_438 = c0._8_8_ + 8;
        local_430 = auStack_4f8;
        local_440[0] = b0_2[2];
        local_440[1] = b0_2[3];
        local_110[0] = b0_2[2];
        local_110[1] = b0_2[3];
        local_428 = _auStack_4f8 +
                    local_438 +
                    b0_2._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_108 = local_438;
        local_100 = local_430;
        afVar11 = ploadu<float__vector(4)>(local_428);
        local_a18[2] = (float)extraout_XMM0_Dc_72;
        local_a18[0] = (float)(int)afVar11._0_8_;
        local_a18[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_a18[3] = extraout_XMM0_Dd_72;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_a18,(float (*) [4])auStack_9e8,
                          (float (*) [4])auStack_9c8);
        unique0x10000ea8 = (float)extraout_XMM0_Dc_73;
        auStack_9c8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_9c8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10000eac = extraout_XMM0_Dd_73;
      }
      pfVar9 = (float *)(resIncr_local + c0._8_8_ * 4);
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4));
      local_a38[2] = (float)extraout_XMM0_Dc_74;
      local_a38[0] = (float)(int)afVar11._0_8_;
      local_a38[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_a38[3] = extraout_XMM0_Dd_74;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_988,(float (*) [4])(palpha_half + 2),&local_a38);
      local_a28[2] = (float)extraout_XMM0_Dc_75;
      local_a28[0] = (float)(int)afVar12._0_8_;
      local_a28[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_a28[3] = extraout_XMM0_Dd_75;
      pstoreu<float,float__vector(4)>(pfVar9,&local_a28);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x10));
      local_a58[2] = (float)extraout_XMM0_Dc_76;
      local_a58[0] = (float)(int)afVar11._0_8_;
      local_a58[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_a58[3] = extraout_XMM0_Dd_76;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_9a8,(float (*) [4])(palpha_half + 2),&local_a58);
      local_a48[2] = (float)extraout_XMM0_Dc_77;
      local_a48[0] = (float)(int)afVar12._0_8_;
      local_a48[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_a48[3] = extraout_XMM0_Dd_77;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x10),&local_a48);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x20));
      unique0x10000f5c = extraout_XMM0_Dc_78;
      c0_3._8_8_ = afVar11._0_8_;
      unique0x10000f60 = extraout_XMM0_Dd_78;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_9c8,(float (*) [4])(palpha_half + 2),
                           (float (*) [4])(c0_3 + 2));
      local_a68[2] = (float)extraout_XMM0_Dc_79;
      local_a68[0] = (float)(int)afVar12._0_8_;
      local_a68[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_a68[3] = extraout_XMM0_Dd_79;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x20),&local_a68);
      c0._8_8_ = c0._8_8_ + 0xc;
    }
    if ((long)c0._8_8_ < lVar6) {
      local_a8c = 0.0;
      afVar11 = pset1<float__vector(4)>(&local_a8c);
      unique0x10000fa4 = (float)extraout_XMM0_Dc_80;
      auStack_a88._0_4_ = (float)(int)afVar11._0_8_;
      auStack_a88._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000fa8 = extraout_XMM0_Dd_80;
      j_3._4_4_ = 0;
      afVar11 = pset1<float__vector(4)>((float *)((long)&j_3 + 4));
      unique0x10000fc8 = (float)extraout_XMM0_Dc_81;
      auStack_aa8._0_4_ = (float)(int)afVar11._0_8_;
      auStack_aa8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10000fcc = extraout_XMM0_Dd_81;
      b0_3[2] = (float)(undefined4)jend;
      b0_3[3] = (float)jend._4_4_;
      for (; (long)b0_3._8_8_ < local_588; b0_3._8_8_ = b0_3._8_8_ + 1) {
        local_58 = res_local;
        local_60[0] = b0_3[2];
        local_60[1] = b0_3[3];
        local_68 = 0;
        afVar11 = pset1<float__vector(4)>((float *)(*(long *)res_local + b0_3._8_8_ * 4));
        unique0x10000fec = (float)extraout_XMM0_Dc_82;
        auStack_ac8._0_4_ = (float)(int)afVar11._0_8_;
        auStack_ac8._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        unique0x10000ff0 = extraout_XMM0_Dd_82;
        local_450 = auStack_4f8;
        local_458[0] = c0[2];
        local_458[1] = c0[3];
        local_460[0] = b0_3[2];
        local_460[1] = b0_3[3];
        local_f0[0] = c0[2];
        local_f0[1] = c0[3];
        local_f8[0] = b0_3[2];
        local_f8[1] = b0_3[3];
        local_448 = _auStack_4f8 +
                    c0._8_8_ +
                    b0_3._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_e8 = local_450;
        afVar11 = ploadu<float__vector(4)>(local_448);
        local_ad8[2] = (float)extraout_XMM0_Dc_83;
        local_ad8[0] = (float)(int)afVar11._0_8_;
        local_ad8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_ad8[3] = extraout_XMM0_Dd_83;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_ad8,(float (*) [4])auStack_ac8,
                          (float (*) [4])auStack_a88);
        unique0x10001034 = (float)extraout_XMM0_Dc_84;
        auStack_a88._0_4_ = (float)(int)afVar12._0_8_;
        auStack_a88._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10001038 = extraout_XMM0_Dd_84;
        local_478 = c0._8_8_ + 4;
        local_470 = auStack_4f8;
        local_480[0] = b0_3[2];
        local_480[1] = b0_3[3];
        local_e0[0] = b0_3[2];
        local_e0[1] = b0_3[3];
        local_468 = _auStack_4f8 +
                    local_478 +
                    b0_3._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_d8 = local_478;
        local_d0 = local_470;
        afVar11 = ploadu<float__vector(4)>(local_468);
        local_ae8[2] = (float)extraout_XMM0_Dc_85;
        local_ae8[0] = (float)(int)afVar11._0_8_;
        local_ae8[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_ae8[3] = extraout_XMM0_Dd_85;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_ae8,(float (*) [4])auStack_ac8,
                          (float (*) [4])auStack_aa8);
        unique0x1000107c = (float)extraout_XMM0_Dc_86;
        auStack_aa8._0_4_ = (float)(int)afVar12._0_8_;
        auStack_aa8._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x10001080 = extraout_XMM0_Dd_86;
      }
      pfVar9 = (float *)(resIncr_local + c0._8_8_ * 4);
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4));
      local_b08[2] = (float)extraout_XMM0_Dc_87;
      local_b08[0] = (float)(int)afVar11._0_8_;
      local_b08[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      local_b08[3] = extraout_XMM0_Dd_87;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_a88,(float (*) [4])(palpha_half + 2),&local_b08);
      local_af8[2] = (float)extraout_XMM0_Dc_88;
      local_af8[0] = (float)(int)afVar12._0_8_;
      local_af8[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_af8[3] = extraout_XMM0_Dd_88;
      pstoreu<float,float__vector(4)>(pfVar9,&local_af8);
      lVar2 = resIncr_local + c0._8_8_ * 4;
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4 + 0x10));
      unique0x100010e8 = extraout_XMM0_Dc_89;
      c0_4._8_8_ = afVar11._0_8_;
      unique0x100010ec = extraout_XMM0_Dd_89;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_aa8,(float (*) [4])(palpha_half + 2),
                           (float (*) [4])(c0_4 + 2));
      local_b18[2] = (float)extraout_XMM0_Dc_90;
      local_b18[0] = (float)(int)afVar12._0_8_;
      local_b18[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_b18[3] = extraout_XMM0_Dd_90;
      pstoreu<float,float__vector(4)>((float *)(lVar2 + 0x10),&local_b18);
      c0._8_8_ = c0._8_8_ + 8;
    }
    if ((long)c0._8_8_ < lVar7) {
      j_4._4_4_ = 0;
      afVar11 = pset1<float__vector(4)>((float *)((long)&j_4 + 4));
      unique0x10001130 = (float)extraout_XMM0_Dc_91;
      auStack_b38._0_4_ = (float)(int)afVar11._0_8_;
      auStack_b38._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      unique0x10001134 = extraout_XMM0_Dd_91;
      b0_4[2] = (float)(undefined4)jend;
      b0_4[3] = (float)jend._4_4_;
      for (; (long)b0_4._8_8_ < local_588; b0_4._8_8_ = b0_4._8_8_ + 1) {
        local_70 = res_local;
        local_78[0] = b0_4[2];
        local_78[1] = b0_4[3];
        local_80 = 0;
        afVar11 = pset1<float__vector(4)>((float *)(*(long *)res_local + b0_4._8_8_ * 4));
        unique0x10001154 = (float)extraout_XMM0_Dc_92;
        auStack_b58._0_4_ = (float)(int)afVar11._0_8_;
        auStack_b58._4_4_ = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        unique0x10001158 = extraout_XMM0_Dd_92;
        local_490 = auStack_4f8;
        local_498[0] = c0[2];
        local_498[1] = c0[3];
        local_4a0[0] = b0_4[2];
        local_4a0[1] = b0_4[3];
        local_c0[0] = c0[2];
        local_c0[1] = c0[3];
        local_c8[0] = b0_4[2];
        local_c8[1] = b0_4[3];
        local_488 = _auStack_4f8 +
                    c0._8_8_ +
                    b0_4._8_8_ * (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
        ;
        local_b8 = local_490;
        afVar11 = ploadu<float__vector(4)>(local_488);
        local_b68[2] = (float)extraout_XMM0_Dc_93;
        local_b68[0] = (float)(int)afVar11._0_8_;
        local_b68[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
        local_b68[3] = extraout_XMM0_Dd_93;
        afVar12 = conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                  ::pmadd((conj_helper<__attribute__((__vector_size__(4_*_sizeof(float))))_float,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_false,_false>
                           *)((long)&lhsStride + 6),&local_b68,(float (*) [4])auStack_b58,
                          (float (*) [4])auStack_b38);
        unique0x1000119c = (float)extraout_XMM0_Dc_94;
        auStack_b38._0_4_ = (float)(int)afVar12._0_8_;
        auStack_b38._4_4_ = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
        unique0x100011a0 = extraout_XMM0_Dd_94;
      }
      pfVar9 = (float *)(resIncr_local + c0._8_8_ * 4);
      afVar11 = ploadu<float__vector(4)>((float *)(resIncr_local + c0._8_8_ * 4));
      afStack_b88[2] = (float)extraout_XMM0_Dc_95;
      afStack_b88[0] = (float)(int)afVar11._0_8_;
      afStack_b88[1] = (float)(int)((ulong)afVar11._0_8_ >> 0x20);
      afStack_b88[3] = extraout_XMM0_Dd_95;
      afVar12 = pmadd<float__vector(4)>
                          ((float (*) [4])auStack_b38,(float (*) [4])(palpha_half + 2),&afStack_b88)
      ;
      local_b78[2] = (float)extraout_XMM0_Dc_96;
      local_b78[0] = (float)(int)afVar12._0_8_;
      local_b78[1] = (float)(int)((ulong)afVar12._0_8_ >> 0x20);
      local_b78[3] = extraout_XMM0_Dd_96;
      pstoreu<float,float__vector(4)>(pfVar9,&local_b78);
      c0._8_8_ = c0._8_8_ + 4;
    }
    for (; (long)c0._8_8_ < cols_local; c0._8_8_ = c0._8_8_ + 1) {
      j_5._4_4_ = 0.0;
      for (local_b98 = jend; local_b98 < local_588; local_b98 = local_b98 + 1) {
        local_88 = auStack_4f8;
        local_90[0] = c0[2];
        local_90[1] = c0[3];
        local_98 = local_b98;
        local_a0 = res_local;
        local_a8 = local_b98;
        local_b0 = 0;
        fVar10 = conj_helper<float,_float,_false,_false>::pmul
                           ((conj_helper<float,_float,_false,_false> *)((long)&lhsStride + 7),
                            _auStack_4f8 +
                            c0._8_8_ +
                            local_b98 *
                            (long)lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data,
                            (float *)(*(long *)res_local + local_b98 * 4));
        j_5._4_4_ = fVar10 + j_5._4_4_;
      }
      *(float *)(resIncr_local + c0._8_8_ * 4) =
           lhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride._4_4_ * j_5._4_4_ +
           *(float *)(resIncr_local + c0._8_8_ * 4);
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}